

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lookup.cpp
# Opt level: O3

void __thiscall
slang::ast::anon_unknown_39::NameComponents::NameComponents(NameComponents *this,NameSyntax *name)

{
  uint uVar1;
  SyntaxKind SVar2;
  SyntaxNode *pSVar3;
  ClassNameSyntax *cn;
  string_view sVar4;
  SourceRange SVar5;
  Token local_28;
  
  (this->selectors)._M_ptr = (pointer)0x0;
  (this->selectors)._M_extent._M_extent_value = 0;
  (this->range).startLoc = (SourceLocation)0x0;
  (this->range).endLoc = (SourceLocation)0x0;
  (this->text)._M_len = 0;
  (this->text)._M_str = (char *)0x0;
  this->paramAssignments = (ParameterValueAssignmentSyntax *)0x0;
  SVar2 = (name->super_ExpressionSyntax).super_SyntaxNode.kind;
  if ((int)SVar2 < 0xe6) {
    uVar1 = SVar2 - ArrayAndMethod;
    if (((uVar1 < 0x35) && ((0x1bUL >> ((ulong)uVar1 & 0x3f) & 1) == 0)) && ((ulong)uVar1 == 0x34))
    {
      local_28._0_8_ = *(undefined8 *)&name[1].super_ExpressionSyntax.super_SyntaxNode;
      local_28.info = (Info *)name[1].super_ExpressionSyntax.super_SyntaxNode.parent;
      sVar4 = parsing::Token::valueText(&local_28);
      this->text = sVar4;
      SVar5 = parsing::Token::range(&local_28);
      this->range = SVar5;
      this->paramAssignments =
           (ParameterValueAssignmentSyntax *)
           name[1].super_ExpressionSyntax.super_SyntaxNode.previewNode;
      return;
    }
  }
  else if (((int)SVar2 < 0x1c5) && (SVar2 == IdentifierSelectName)) {
    local_28._0_8_ = *(undefined8 *)&name[1].super_ExpressionSyntax.super_SyntaxNode;
    local_28.info = (Info *)name[1].super_ExpressionSyntax.super_SyntaxNode.parent;
    sVar4 = parsing::Token::valueText(&local_28);
    this->text = sVar4;
    SVar5 = parsing::Token::range(&local_28);
    this->range = SVar5;
    pSVar3 = name[3].super_ExpressionSyntax.super_SyntaxNode.previewNode;
    (this->selectors)._M_ptr = (pointer)name[3].super_ExpressionSyntax.super_SyntaxNode.parent;
    (this->selectors)._M_extent._M_extent_value = (size_t)pSVar3;
    return;
  }
  local_28._0_8_ = *(undefined8 *)&name[1].super_ExpressionSyntax.super_SyntaxNode;
  local_28.info = (Info *)name[1].super_ExpressionSyntax.super_SyntaxNode.parent;
  sVar4 = parsing::Token::valueText(&local_28);
  this->text = sVar4;
  SVar5 = parsing::Token::range(&local_28);
  this->range = SVar5;
  return;
}

Assistant:

NameComponents(const NameSyntax& name) {
        switch (name.kind) {
            case SyntaxKind::IdentifierName:
                set(name.as<IdentifierNameSyntax>().identifier);
                break;
            case SyntaxKind::SystemName:
                set(name.as<SystemNameSyntax>().systemIdentifier);
                break;
            case SyntaxKind::IdentifierSelectName: {
                auto& idSelect = name.as<IdentifierSelectNameSyntax>();
                set(idSelect.identifier);
                selectors = idSelect.selectors;
                break;
            }
            case SyntaxKind::ClassName: {
                auto& cn = name.as<ClassNameSyntax>();
                set(cn.identifier);
                paramAssignments = cn.parameters;
                break;
            }
            case SyntaxKind::UnitScope:
            case SyntaxKind::RootScope:
            case SyntaxKind::LocalScope:
            case SyntaxKind::ThisHandle:
            case SyntaxKind::SuperHandle:
            case SyntaxKind::ArrayUniqueMethod:
            case SyntaxKind::ArrayAndMethod:
            case SyntaxKind::ArrayOrMethod:
            case SyntaxKind::ArrayXorMethod:
            case SyntaxKind::ConstructorName:
                set(name.as<KeywordNameSyntax>().keyword);
                break;
            default:
                SLANG_UNREACHABLE;
        }
    }